

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::ServiceDescriptorProto::SerializeWithCachedSizesToArray
          (ServiceDescriptorProto *this,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  MethodDescriptorProto *this_00;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  uint32 value;
  long lVar4;
  uint8 *puVar5;
  ServiceOptions *this_01;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar2 = this->name_;
    *target = '\n';
    value = (uint32)psVar2->_M_string_length;
    if (value < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar5 = target + 2;
    }
    else {
      puVar5 = io::CodedOutputStream::WriteVarint32FallbackToArray(value,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar5);
  }
  if (0 < (this->method_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      this_00 = (MethodDescriptorProto *)(this->method_).super_RepeatedPtrFieldBase.elements_[lVar4]
      ;
      *target = '\x12';
      uVar1 = this_00->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar5 = target + 2;
      }
      else {
        puVar5 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = MethodDescriptorProto::SerializeWithCachedSizesToArray(this_00,puVar5);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->method_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((this->_has_bits_[0] & 4) != 0) {
    this_01 = this->options_;
    if (this_01 == (ServiceOptions *)0x0) {
      this_01 = *(ServiceOptions **)(default_instance_ + 0x30);
    }
    *target = '\x1a';
    uVar1 = this_01->_cached_size_;
    if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      puVar5 = target + 2;
    }
    else {
      puVar5 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
    target = ServiceOptions::SerializeWithCachedSizesToArray(this_01,puVar5);
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar5 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* ServiceDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  for (int i = 0; i < this->method_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        2, this->method(i), target);
  }

  // optional .google.protobuf.ServiceOptions options = 3;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        3, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}